

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_float.h
# Opt level: O2

from_chars_result
duckdb_fast_float::detail::parse_infnan<float>(char *first,char *last,float *value)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  char *input1;
  byte *pbVar4;
  undefined8 uVar5;
  long lVar6;
  from_chars_result fVar7;
  
  cVar1 = *first;
  input1 = first + (cVar1 == '-');
  uVar5 = 0x16;
  if (2 < (long)last - (long)input1) {
    bVar3 = fastfloat_strncasecmp(input1,"nan",3);
    if (bVar3) {
      first = input1 + 3;
      *value = *(float *)(&DAT_01fd3f30 + (ulong)(cVar1 == '-') * 4);
      uVar5 = 0;
      if ((first != last) && (*first == 0x28)) {
        for (pbVar4 = (byte *)(input1 + 4); uVar5 = 0, pbVar4 != (byte *)last; pbVar4 = pbVar4 + 1)
        {
          bVar2 = *pbVar4;
          if (bVar2 == 0x29) {
            first = (char *)(pbVar4 + 1);
            goto LAB_01276bf4;
          }
          if ((0x19 < (byte)((bVar2 & 0xdf) + 0xbf)) && (bVar2 != 0x5f && 9 < (byte)(bVar2 - 0x30)))
          break;
        }
      }
    }
    else {
      lVar6 = 3;
      bVar3 = fastfloat_strncasecmp(input1,"inf",3);
      if (bVar3) {
        if (7 < (ulong)((long)last - (long)input1)) {
          bVar3 = fastfloat_strncasecmp(input1 + 3,"inity",5);
          if (bVar3) {
            lVar6 = 8;
          }
        }
        first = input1 + lVar6;
        *value = *(float *)(&DAT_01fd3f28 + (ulong)(cVar1 == '-') * 4);
LAB_01276bf4:
        uVar5 = 0;
      }
    }
  }
  fVar7._8_8_ = uVar5;
  fVar7.ptr = first;
  return fVar7;
}

Assistant:

from_chars_result parse_infnan(const char *first, const char *last, T &value)  noexcept  {
  from_chars_result answer;
  answer.ptr = first;
  answer.ec = std::errc(); // be optimistic
  bool minusSign = false;
  if (*first == '-') { // assume first < last, so dereference without checks; C++17 20.19.3.(7.1) explicitly forbids '+' here
      minusSign = true;
      ++first;
  }
  if (last - first >= 3) {
    if (fastfloat_strncasecmp(first, "nan", 3)) {
      answer.ptr = (first += 3);
      value = minusSign ? -std::numeric_limits<T>::quiet_NaN() : std::numeric_limits<T>::quiet_NaN();
      // Check for possible nan(n-char-seq-opt), C++17 20.19.3.7, C11 7.20.1.3.3. At least MSVC produces nan(ind) and nan(snan).
      if(first != last && *first == '(') {
        for(const char* ptr = first + 1; ptr != last; ++ptr) {
          if (*ptr == ')') {
            answer.ptr = ptr + 1; // valid nan(n-char-seq-opt)
            break;
          }
          else if(!(('a' <= *ptr && *ptr <= 'z') || ('A' <= *ptr && *ptr <= 'Z') || ('0' <= *ptr && *ptr <= '9') || *ptr == '_'))
            break; // forbidden char, not nan(n-char-seq-opt)
        }
      }
      return answer;
    }
    if (fastfloat_strncasecmp(first, "inf", 3)) {
      if ((last - first >= 8) && fastfloat_strncasecmp(first + 3, "inity", 5)) {
        answer.ptr = first + 8;
      } else {
        answer.ptr = first + 3;
      }
      value = minusSign ? -std::numeric_limits<T>::infinity() : std::numeric_limits<T>::infinity();
      return answer;
    }
  }
  answer.ec = std::errc::invalid_argument;
  return answer;
}